

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_multi_statemach(Curl_easy *data,_Bool *done)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  
  pcVar1 = data->conn;
  CVar2 = Curl_pp_statemach(data,&(pcVar1->proto).ftpc.pp,false,false);
  *done = (pcVar1->proto).pop3c.state == POP3_STOP;
  return CVar2;
}

Assistant:

static CURLcode pop3_multi_statemach(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  result = Curl_pp_statemach(data, &pop3c->pp, FALSE, FALSE);
  *done = (pop3c->state == POP3_STOP);

  return result;
}